

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TileSwitch.cpp
# Opt level: O0

void __thiscall TileSwitch::setCharID(TileSwitch *this,char charID)

{
  bool bVar1;
  reference ppTVar2;
  pointer ppVar3;
  mapped_type *this_00;
  Board *pBVar4;
  char in_SIL;
  Tile *in_RDI;
  iterator vectorIter;
  iterator mapIter;
  unordered_map<char,_std::vector<TileSwitch_*,_std::allocator<TileSwitch_*>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::vector<TileSwitch_*,_std::allocator<TileSwitch_*>_>_>_>_>
  *in_stack_ffffffffffffff28;
  locale *this_01;
  unordered_map<Tile_*,_sf::Text,_std::hash<Tile_*>,_std::equal_to<Tile_*>,_std::allocator<std::pair<Tile_*const,_sf::Text>_>_>
  *in_stack_ffffffffffffff30;
  vector<TileSwitch_*,_std::allocator<TileSwitch_*>_> *in_stack_ffffffffffffff40;
  allocator *paVar5;
  const_iterator __position;
  locale local_a8 [24];
  locale *in_stack_ffffffffffffff70;
  string *in_stack_ffffffffffffff78;
  String *in_stack_ffffffffffffff80;
  __normal_iterator<TileSwitch_**,_std::vector<TileSwitch_*,_std::allocator<TileSwitch_*>_>_>
  local_20;
  _Node_iterator_base<std::pair<const_char,_std::vector<TileSwitch_*,_std::allocator<TileSwitch_*>_>_>,_false>
  local_18;
  char local_9;
  
  local_9 = in_SIL;
  Tile::getBoardPtr(in_RDI);
  local_18._M_cur =
       (__node_type *)
       std::
       unordered_map<char,_std::vector<TileSwitch_*,_std::allocator<TileSwitch_*>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::vector<TileSwitch_*,_std::allocator<TileSwitch_*>_>_>_>_>
       ::find(in_stack_ffffffffffffff28,(key_type *)0x19f933);
  std::__detail::
  _Node_iterator<std::pair<const_char,_std::vector<TileSwitch_*,_std::allocator<TileSwitch_*>_>_>,_false,_false>
  ::operator->((_Node_iterator<std::pair<const_char,_std::vector<TileSwitch_*,_std::allocator<TileSwitch_*>_>_>,_false,_false>
                *)0x19f948);
  local_20._M_current =
       (TileSwitch **)
       std::vector<TileSwitch_*,_std::allocator<TileSwitch_*>_>::begin
                 ((vector<TileSwitch_*,_std::allocator<TileSwitch_*>_> *)in_stack_ffffffffffffff28);
  do {
    std::__detail::
    _Node_iterator<std::pair<const_char,_std::vector<TileSwitch_*,_std::allocator<TileSwitch_*>_>_>,_false,_false>
    ::operator->((_Node_iterator<std::pair<const_char,_std::vector<TileSwitch_*,_std::allocator<TileSwitch_*>_>_>,_false,_false>
                  *)0x19f969);
    std::vector<TileSwitch_*,_std::allocator<TileSwitch_*>_>::end
              ((vector<TileSwitch_*,_std::allocator<TileSwitch_*>_> *)in_stack_ffffffffffffff28);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<TileSwitch_**,_std::vector<TileSwitch_*,_std::allocator<TileSwitch_*>_>_>
                        *)in_stack_ffffffffffffff30,
                       (__normal_iterator<TileSwitch_**,_std::vector<TileSwitch_*,_std::allocator<TileSwitch_*>_>_>
                        *)in_stack_ffffffffffffff28);
    if (!bVar1) {
LAB_0019fa0a:
      in_RDI->field_0x21 = local_9;
      Tile::getBoardPtr(in_RDI);
      std::
      unordered_map<char,_std::vector<TileSwitch_*,_std::allocator<TileSwitch_*>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::vector<TileSwitch_*,_std::allocator<TileSwitch_*>_>_>_>_>
      ::operator[]((unordered_map<char,_std::vector<TileSwitch_*,_std::allocator<TileSwitch_*>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::vector<TileSwitch_*,_std::allocator<TileSwitch_*>_>_>_>_>
                    *)in_stack_ffffffffffffff30,(key_type *)in_stack_ffffffffffffff28);
      std::vector<TileSwitch_*,_std::allocator<TileSwitch_*>_>::push_back
                ((vector<TileSwitch_*,_std::allocator<TileSwitch_*>_> *)in_stack_ffffffffffffff30,
                 (value_type *)in_stack_ffffffffffffff28);
      Tile::getBoardPtr(in_RDI);
      this_00 = std::
                unordered_map<Tile_*,_sf::Text,_std::hash<Tile_*>,_std::equal_to<Tile_*>,_std::allocator<std::pair<Tile_*const,_sf::Text>_>_>
                ::operator[](in_stack_ffffffffffffff30,(key_type *)in_stack_ffffffffffffff28);
      paVar5 = (allocator *)&stack0xffffffffffffff77;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&stack0xffffffffffffff78,1,local_9,paVar5);
      this_01 = local_a8;
      std::locale::locale(this_01);
      sf::String::String(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                         in_stack_ffffffffffffff70);
      sf::Text::setString(this_00,(String *)this_01);
      sf::String::~String((String *)0x19faf8);
      std::locale::~locale(local_a8);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff78);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff77);
      (*in_RDI->_vptr_Tile[8])(in_RDI,1,0);
      pBVar4 = Tile::getBoardPtr(in_RDI);
      pBVar4->changesMade = true;
      return;
    }
    ppTVar2 = __gnu_cxx::
              __normal_iterator<TileSwitch_**,_std::vector<TileSwitch_*,_std::allocator<TileSwitch_*>_>_>
              ::operator*(&local_20);
    if (&(*ppTVar2)->super_Tile == in_RDI) {
      ppVar3 = std::__detail::
               _Node_iterator<std::pair<const_char,_std::vector<TileSwitch_*,_std::allocator<TileSwitch_*>_>_>,_false,_false>
               ::operator->((_Node_iterator<std::pair<const_char,_std::vector<TileSwitch_*,_std::allocator<TileSwitch_*>_>_>,_false,_false>
                             *)0x19f9bc);
      __position._M_current = (TileSwitch **)&ppVar3->second;
      __gnu_cxx::
      __normal_iterator<TileSwitch*const*,std::vector<TileSwitch*,std::allocator<TileSwitch*>>>::
      __normal_iterator<TileSwitch**>
                ((__normal_iterator<TileSwitch_*const_*,_std::vector<TileSwitch_*,_std::allocator<TileSwitch_*>_>_>
                  *)in_stack_ffffffffffffff30,
                 (__normal_iterator<TileSwitch_**,_std::vector<TileSwitch_*,_std::allocator<TileSwitch_*>_>_>
                  *)in_stack_ffffffffffffff28);
      std::vector<TileSwitch_*,_std::allocator<TileSwitch_*>_>::erase
                (in_stack_ffffffffffffff40,__position);
      goto LAB_0019fa0a;
    }
    __gnu_cxx::
    __normal_iterator<TileSwitch_**,_std::vector<TileSwitch_*,_std::allocator<TileSwitch_*>_>_>::
    operator++(&local_20);
  } while( true );
}

Assistant:

void TileSwitch::setCharID(char charID) {
    auto mapIter = getBoardPtr()->switchKeybinds.find(_charID);
    for (auto vectorIter = mapIter->second.begin(); vectorIter != mapIter->second.end(); ++vectorIter) {
        if (*vectorIter == this) {
            mapIter->second.erase(vectorIter);
            break;
        }
    }
    _charID = charID;
    getBoardPtr()->switchKeybinds[charID].push_back(this);
    getBoardPtr()->tileLabels[this].setString(string(1, charID));
    addUpdate(true);
    getBoardPtr()->changesMade = true;
}